

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.h
# Opt level: O0

int __thiscall S2CopyingEdgeCrosser::CrossingSign(S2CopyingEdgeCrosser *this,S2Point *d)

{
  int iVar1;
  int result;
  S2Point *d_local;
  S2CopyingEdgeCrosser *this_local;
  
  iVar1 = S2EdgeCrosser::CrossingSign(&this->crosser_,d);
  (this->c_).c_[0] = d->c_[0];
  (this->c_).c_[1] = d->c_[1];
  (this->c_).c_[2] = d->c_[2];
  S2EdgeCrosser::set_c(&this->crosser_,&this->c_);
  return iVar1;
}

Assistant:

inline int S2CopyingEdgeCrosser::CrossingSign(const S2Point& d) {
  int result = crosser_.CrossingSign(&d);
  c_ = d;
  crosser_.set_c(&c_);
  return result;
}